

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O0

void witness_depth_error_impl(witness_list_t *witnesses,witness_rank_t rank_inclusive,uint depth)

{
  uint in_EDX;
  char *pcVar1;
  uint in_ESI;
  long *in_RDI;
  witness_t *w;
  undefined8 *local_20;
  undefined8 *local_18;
  
  pcVar1 = "";
  if (in_EDX != 1) {
    pcVar1 = "s";
  }
  malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:",(ulong)in_EDX,pcVar1,(ulong)in_ESI
               );
  local_18 = (undefined8 *)*in_RDI;
  while (local_18 != (undefined8 *)0x0) {
    malloc_printf(" %s(%u)",*local_18,(ulong)*(uint *)(local_18 + 1));
    if (local_18[4] == *in_RDI) {
      local_20 = (undefined8 *)0x0;
    }
    else {
      local_20 = (undefined8 *)local_18[4];
    }
    local_18 = local_20;
  }
  malloc_printf("\n");
  abort();
}

Assistant:

static void
witness_depth_error_impl(const witness_list_t *witnesses,
    witness_rank_t rank_inclusive, unsigned depth) {
	witness_t *w;

	malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:", depth,
	    (depth != 1) ?  "s" : "", rank_inclusive);
	ql_foreach(w, witnesses, link) {
		malloc_printf(" %s(%u)", w->name, w->rank);
	}
	malloc_printf("\n");
	abort();
}